

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

word * Ssc_GiaGetCareMask(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  word *pwVar5;
  ulong uVar6;
  int iVar7;
  word *__s;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar1 = p->nRegs;
  uVar6 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - iVar1);
  iVar7 = (int)uVar6;
  __s = (word *)malloc((long)iVar7 << 3);
  memset(__s,0xff,(long)iVar7 << 3);
  pVVar4 = p->vCos;
  uVar2 = pVVar4->nSize;
  if (uVar2 - iVar1 != 0 && iVar1 <= (int)uVar2) {
    uVar9 = 0;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar9;
    }
    do {
      if (uVar9 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar4->pArray[uVar9];
      if ((iVar3 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return __s;
      }
      uVar10 = iVar3 * iVar7;
      if (((int)uVar10 < 0) || (p->vSims->nSize <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if (0 < iVar7) {
        pwVar5 = p->vSims->pArray;
        uVar11 = 0;
        do {
          __s[uVar11] = __s[uVar11] & pwVar5[uVar10 + uVar11];
          uVar11 = uVar11 + 1;
        } while ((uVar6 & 0xffffffff) != uVar11);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2 - iVar1);
  }
  return __s;
}

Assistant:

word * Ssc_GiaGetCareMask( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nWords = Gia_ObjSimWords( p );
    word * pRes = ABC_FALLOC( word, nWords );
    Gia_ManForEachPo( p, pObj, i )
        Ssc_SimAnd( pRes, pRes, Gia_ObjSimObj(p, pObj), nWords, 0, 0 );
    return pRes;
}